

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImRect ImGui::ShowMetricsWindow::Funcs::GetTableRect(ImGuiTable *table,int rect_type,int n)

{
  ImGuiTableColumn *pIVar1;
  ImVec2 IVar2;
  float fVar3;
  ImVec2 IVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImRect IVar8;
  
  switch(rect_type) {
  case 0:
    IVar2 = (table->OuterRect).Min;
    IVar4 = (table->OuterRect).Max;
    break;
  case 1:
    IVar2 = (table->InnerRect).Min;
    IVar4 = (table->InnerRect).Max;
    break;
  case 2:
    IVar2 = (table->WorkRect).Min;
    IVar4 = (table->WorkRect).Max;
    break;
  case 3:
    IVar2 = (table->HostClipRect).Min;
    IVar4 = (table->HostClipRect).Max;
    break;
  case 4:
    IVar2 = (table->InnerClipRect).Min;
    IVar4 = (table->InnerClipRect).Max;
    break;
  case 5:
    IVar2 = (table->BgClipRect).Min;
    IVar4 = (table->BgClipRect).Max;
    break;
  case 6:
    if ((n < 0) || (pIVar1 = (table->Columns).Data + n, (table->Columns).DataEnd <= pIVar1)) {
LAB_001a53ff:
      __assert_fail("p >= Data && p < DataEnd",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_internal.h"
                    ,0x24a,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
    }
    fVar6 = (table->InnerClipRect).Min.y;
    fVar7 = table->LastOuterHeight + fVar6;
    fVar5 = pIVar1->MinX;
    fVar3 = pIVar1->MaxX;
    goto LAB_001a53d6;
  case 7:
    if ((n < 0) || (pIVar1 = (table->Columns).Data + n, (table->Columns).DataEnd <= pIVar1))
    goto LAB_001a53ff;
    fVar5 = (table->WorkRect).Max.y;
    IVar2.y = (table->WorkRect).Min.y;
    IVar2.x = pIVar1->WorkMinX;
    fVar6 = pIVar1->WorkMaxX;
    goto LAB_001a533b;
  case 8:
    if ((n < 0) || (pIVar1 = (table->Columns).Data + n, (table->Columns).DataEnd <= pIVar1))
    goto LAB_001a53ff;
    IVar2 = (pIVar1->ClipRect).Min;
    IVar4 = (pIVar1->ClipRect).Max;
    break;
  case 9:
    if ((n < 0) || (pIVar1 = (table->Columns).Data + n, (table->Columns).DataEnd <= pIVar1))
    goto LAB_001a53ff;
    fVar6 = (table->InnerClipRect).Min.y;
    fVar7 = table->LastFirstRowHeight + fVar6;
    fVar5 = pIVar1->WorkMinX;
    fVar3 = pIVar1->ContentMaxXHeadersUsed;
    goto LAB_001a53d6;
  case 10:
    if ((n < 0) || (pIVar1 = (table->Columns).Data + n, (table->Columns).DataEnd <= pIVar1))
    goto LAB_001a53ff;
    fVar6 = (table->InnerClipRect).Min.y;
    fVar7 = table->LastFirstRowHeight + fVar6;
    fVar5 = pIVar1->WorkMinX;
    fVar3 = pIVar1->ContentMaxXHeadersIdeal;
    goto LAB_001a53d6;
  case 0xb:
    if ((n < 0) || (pIVar1 = (table->Columns).Data + n, (table->Columns).DataEnd <= pIVar1))
    goto LAB_001a53ff;
    fVar6 = (table->InnerClipRect).Min.y;
    fVar7 = table->LastFirstRowHeight + fVar6;
    fVar5 = pIVar1->WorkMinX;
    fVar3 = pIVar1->ContentMaxXFrozen;
LAB_001a53d6:
    IVar4.y = fVar7;
    IVar4.x = fVar3;
    IVar2.y = fVar6;
    IVar2.x = fVar5;
    break;
  case 0xc:
    if ((n < 0) || (pIVar1 = (table->Columns).Data + n, (table->Columns).DataEnd <= pIVar1))
    goto LAB_001a53ff;
    IVar2.y = (table->InnerClipRect).Min.y + table->LastFirstRowHeight;
    IVar2.x = pIVar1->WorkMinX;
    fVar6 = pIVar1->ContentMaxXUnfrozen;
    fVar5 = (table->InnerClipRect).Max.y;
LAB_001a533b:
    IVar4.y = fVar5;
    IVar4.x = fVar6;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x4127,
                  "static ImRect ImGui::ShowMetricsWindow(bool *)::Funcs::GetTableRect(ImGuiTable *, int, int)"
                 );
  }
  IVar8.Max = IVar4;
  IVar8.Min = IVar2;
  return IVar8;
}

Assistant:

static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }